

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_hdr(char *filename,int x,int y,int comp,float *data)

{
  int iVar1;
  int r;
  stbi__write_context s;
  float *in_stack_00000080;
  int in_stack_0000008c;
  int in_stack_00000090;
  int in_stack_00000094;
  stbi__write_context *in_stack_00000098;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  stbi__write_context *in_stack_ffffffffffffff80;
  int local_4;
  
  memset(&stack0xffffffffffffff80,0,0x58);
  iVar1 = stbi__start_write_file
                    (in_stack_ffffffffffffff80,
                     (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = stbi_write_hdr_core(in_stack_00000098,in_stack_00000094,in_stack_00000090,
                                  in_stack_0000008c,in_stack_00000080);
    stbi__end_write_file((stbi__write_context *)0x2d268b);
  }
  return local_4;
}

Assistant:

STBIWDEF int stbi_write_hdr(char const *filename, int x, int y, int comp, const float *data)
{
   stbi__write_context s = { 0 };
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_hdr_core(&s, x, y, comp, (float *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}